

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTransformUtil.h
# Opt level: O1

void btTransformUtil::calculateDiffAxisAngle
               (btTransform *transform0,btTransform *transform1,btVector3 *axis,btScalar *angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btQuaternion local_58;
  btMatrix3x3 local_48;
  
  fVar12 = (transform0->m_basis).m_el[1].m_floats[1];
  fVar13 = (transform0->m_basis).m_el[1].m_floats[2];
  fVar1 = (transform0->m_basis).m_el[1].m_floats[0];
  fVar20 = (transform0->m_basis).m_el[0].m_floats[0];
  fVar2 = (transform0->m_basis).m_el[0].m_floats[1];
  fVar14 = (transform0->m_basis).m_el[0].m_floats[2];
  fVar3 = (transform1->m_basis).m_el[0].m_floats[0];
  uVar10 = *(undefined8 *)(transform0->m_basis).m_el[2].m_floats;
  fVar4 = (transform0->m_basis).m_el[2].m_floats[2];
  fVar21 = (float)uVar10;
  fVar22 = (float)((ulong)uVar10 >> 0x20);
  fVar15 = fVar21 * fVar13 - fVar4 * fVar1;
  uVar10 = *(undefined8 *)((transform0->m_basis).m_el[2].m_floats + 1);
  fVar19 = (float)((ulong)uVar10 >> 0x20) * fVar12 - fVar13 * fVar22;
  fVar23 = fVar1 * fVar22 - fVar12 * fVar21;
  fVar24 = 1.0 / (fVar23 * fVar14 + fVar19 * fVar20 + fVar15 * fVar2);
  fVar5 = (transform1->m_basis).m_el[0].m_floats[1];
  fVar6 = (transform1->m_basis).m_el[0].m_floats[2];
  fVar7 = (transform1->m_basis).m_el[1].m_floats[0];
  fVar8 = (transform1->m_basis).m_el[1].m_floats[1];
  fVar9 = (transform1->m_basis).m_el[1].m_floats[2];
  fVar16 = (fVar2 * fVar13 + -fVar14 * fVar12) * fVar24;
  fVar17 = (fVar14 * fVar1 + -fVar20 * fVar13) * fVar24;
  fVar11 = (fVar20 * fVar12 + -fVar2 * fVar1) * fVar24;
  fVar18 = ((float)uVar10 * fVar14 - fVar2 * fVar4) * fVar24;
  fVar19 = fVar19 * fVar24;
  fVar14 = (fVar4 * fVar20 - fVar21 * fVar14) * fVar24;
  fVar15 = fVar15 * fVar24;
  fVar20 = fVar24 * (fVar2 * fVar21 - fVar20 * fVar22);
  fVar24 = fVar24 * fVar23;
  fVar12 = (transform1->m_basis).m_el[2].m_floats[0];
  local_48.m_el[0].m_floats[2] = fVar5 * fVar17 + fVar16 * fVar3 + fVar11 * fVar6;
  local_48.m_el[1].m_floats[2] = fVar11 * fVar9 + fVar16 * fVar7 + fVar17 * fVar8;
  fVar13 = (transform1->m_basis).m_el[2].m_floats[1];
  fVar1 = (transform1->m_basis).m_el[2].m_floats[2];
  local_48.m_el[2].m_floats[2] = fVar11 * fVar1 + fVar16 * fVar12 + fVar17 * fVar13;
  local_48.m_el[0].m_floats[1] = fVar6 * fVar20 + fVar3 * fVar18 + fVar5 * fVar14;
  local_48.m_el[0].m_floats[0] = fVar6 * fVar24 + fVar3 * fVar19 + fVar5 * fVar15;
  local_48.m_el[0].m_floats[3] = 0.0;
  local_48.m_el[1].m_floats[1] = fVar9 * fVar20 + fVar7 * fVar18 + fVar8 * fVar14;
  local_48.m_el[1].m_floats[0] = fVar9 * fVar24 + fVar7 * fVar19 + fVar8 * fVar15;
  local_48.m_el[1].m_floats[3] = 0.0;
  local_48.m_el[2].m_floats[1] = fVar1 * fVar20 + fVar12 * fVar18 + fVar13 * fVar14;
  local_48.m_el[2].m_floats[0] = fVar1 * fVar24 + fVar12 * fVar19 + fVar13 * fVar15;
  local_48.m_el[2].m_floats[3] = 0.0;
  btMatrix3x3::getRotation(&local_48,&local_58);
  fVar12 = local_58.super_btQuadWord.m_floats[3] * local_58.super_btQuadWord.m_floats[3] +
           local_58.super_btQuadWord.m_floats[2] * local_58.super_btQuadWord.m_floats[2] +
           local_58.super_btQuadWord.m_floats[0] * local_58.super_btQuadWord.m_floats[0] +
           local_58.super_btQuadWord.m_floats[1] * local_58.super_btQuadWord.m_floats[1];
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar12 = 1.0 / fVar12;
  local_58.super_btQuadWord.m_floats[0] = fVar12 * local_58.super_btQuadWord.m_floats[0];
  local_58.super_btQuadWord.m_floats[1] = fVar12 * local_58.super_btQuadWord.m_floats[1];
  local_58.super_btQuadWord.m_floats[2] = fVar12 * local_58.super_btQuadWord.m_floats[2];
  local_58.super_btQuadWord.m_floats[3] = fVar12 * local_58.super_btQuadWord.m_floats[3];
  fVar12 = -1.0;
  if (-1.0 <= local_58.super_btQuadWord.m_floats[3]) {
    fVar12 = local_58.super_btQuadWord.m_floats[3];
  }
  fVar13 = 1.0;
  if (fVar12 <= 1.0) {
    fVar13 = fVar12;
  }
  fVar12 = acosf(fVar13);
  *angle = fVar12 + fVar12;
  *(ulong *)axis->m_floats =
       CONCAT44(local_58.super_btQuadWord.m_floats[1],local_58.super_btQuadWord.m_floats[0]);
  axis->m_floats[2] = local_58.super_btQuadWord.m_floats[2];
  axis->m_floats[3] = 0.0;
  fVar12 = local_58.super_btQuadWord.m_floats[2] * local_58.super_btQuadWord.m_floats[2] +
           local_58.super_btQuadWord.m_floats[0] * local_58.super_btQuadWord.m_floats[0] +
           local_58.super_btQuadWord.m_floats[1] * local_58.super_btQuadWord.m_floats[1];
  if (1.4210855e-14 <= fVar12) {
    if (fVar12 < 0.0) {
      fVar12 = sqrtf(fVar12);
    }
    else {
      fVar12 = SQRT(fVar12);
    }
    fVar12 = 1.0 / fVar12;
    *(ulong *)axis->m_floats =
         CONCAT44(fVar12 * (float)((ulong)*(undefined8 *)axis->m_floats >> 0x20),
                  fVar12 * (float)*(undefined8 *)axis->m_floats);
    axis->m_floats[2] = fVar12 * axis->m_floats[2];
  }
  else {
    axis->m_floats[0] = 1.0;
    axis->m_floats[1] = 0.0;
    axis->m_floats[2] = 0.0;
    axis->m_floats[3] = 0.0;
  }
  return;
}

Assistant:

static void calculateDiffAxisAngle(const btTransform& transform0,const btTransform& transform1,btVector3& axis,btScalar& angle)
	{
		btMatrix3x3 dmat = transform1.getBasis() * transform0.getBasis().inverse();
		btQuaternion dorn;
		dmat.getRotation(dorn);

		///floating point inaccuracy can lead to w component > 1..., which breaks 
		dorn.normalize();
		
		angle = dorn.getAngle();
		axis = btVector3(dorn.x(),dorn.y(),dorn.z());
		axis[3] = btScalar(0.);
		//check for axis length
		btScalar len = axis.length2();
		if (len < SIMD_EPSILON*SIMD_EPSILON)
			axis = btVector3(btScalar(1.),btScalar(0.),btScalar(0.));
		else
			axis /= btSqrt(len);
	}